

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_picker.cpp
# Opt level: O2

void QtMWidgets::Picker::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QVariant *this;
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  undefined8 uVar4;
  PrivateShared *pPVar5;
  undefined8 uVar6;
  int iVar7;
  Spec index;
  QColor *c;
  QColor QVar8;
  anon_union_24_3_e3d07ef4_for_data local_38;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      activated((Picker *)_o,*_a[1]);
      return;
    case 1:
      activated((Picker *)_o,(QString *)_a[1]);
      return;
    case 2:
      currentIndexChanged((Picker *)_o,*_a[1]);
      return;
    case 3:
      currentIndexChanged((Picker *)_o,(QString *)_a[1]);
      return;
    case 4:
      currentTextChanged((Picker *)_o,(QString *)_a[1]);
      return;
    case 5:
      clear((Picker *)_o);
      return;
    case 6:
      index = *_a[1];
LAB_00167341:
      setCurrentIndex((Picker *)_o,index);
      return;
    case 7:
      c = (QColor *)_a[1];
switchD_0016709f_caseD_2:
      setCurrentText((Picker *)_o,(QString *)c);
      return;
    case 8:
      scrollTo((Picker *)_o,*_a[1]);
      return;
    case 9:
      _q_emitCurrentIndexChanged((Picker *)_o,(QModelIndex *)_a[1]);
      return;
    case 10:
      _q_dataChanged((Picker *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2]);
      return;
    case 0xb:
      _q_updateIndexBeforeChange((Picker *)_o);
      return;
    case 0xc:
      _q_rowsInserted((Picker *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
      return;
    case 0xd:
      _q_rowsRemoved((Picker *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
      return;
    case 0xe:
      _q_modelDestroyed((Picker *)_o);
      return;
    case 0xf:
      _q_modelReset((Picker *)_o);
      return;
    case 0x10:
      _q_scroll((Picker *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case ReadProperty:
    if (6 < (uint)_id) {
      return;
    }
    this = (QVariant *)*_a;
    switch(_id) {
    case 0:
      iVar7 = count((Picker *)_o);
      break;
    case 1:
      iVar7 = currentIndex((Picker *)_o);
      break;
    case 2:
      currentText((QString *)&local_38,(Picker *)_o);
      pPVar5 = (this->d).data.shared;
      uVar6 = *(undefined8 *)((long)&(this->d).data + 8);
      (this->d).data.shared = local_38.shared;
      *(undefined8 *)((long)&(this->d).data + 8) = local_38._8_8_;
      uVar4 = *(undefined8 *)((long)&(this->d).data + 0x10);
      *(undefined8 *)((long)&(this->d).data + 0x10) = local_38._16_8_;
      local_38.shared = pPVar5;
      local_38._8_8_ = uVar6;
      local_38._16_8_ = uVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
      return;
    case 3:
      currentData((QVariant *)&local_38,(Picker *)_o,0x100);
      QVariant::operator=(this,(QVariant *)&local_38);
      QVariant::~QVariant((QVariant *)&local_38);
      return;
    case 4:
      iVar7 = modelColumn((Picker *)_o);
      break;
    case 5:
      iVar7 = maxCount((Picker *)_o);
      break;
    case 6:
      QVar8 = highlightColor((Picker *)_o);
      (this->d).data.shared = QVar8._0_8_;
      *(int *)((long)&(this->d).data + 8) = QVar8.ct._4_4_;
      *(short *)((long)&(this->d).data + 0xc) = QVar8.ct._8_2_;
      return;
    }
    *(int *)&(this->d).data = iVar7;
    break;
  case WriteProperty:
    if (_id - 1U < 6) {
      c = (QColor *)*_a;
      switch(_id) {
      case 1:
        index = c->cspec;
        goto LAB_00167341;
      case 2:
        goto switchD_0016709f_caseD_2;
      case 4:
        setModelColumn((Picker *)_o,c->cspec);
        return;
      case 5:
        setMaxCount((Picker *)_o,c->cspec);
        return;
      case 6:
        setHighlightColor((Picker *)_o,c);
        return;
      }
    }
    break;
  case IndexOfMethod:
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == activated && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == activated && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == currentIndexChanged && lVar3 == 0) {
      *puVar1 = 2;
    }
    else if (pcVar2 == currentIndexChanged && lVar3 == 0) {
      *puVar1 = 3;
    }
    else if (pcVar2 == currentTextChanged && lVar3 == 0) {
      *puVar1 = 4;
    }
  }
  return;
}

Assistant:

void QtMWidgets::Picker::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->clear(); break;
        case 6: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setCurrentText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->scrollTo((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->_q_emitCurrentIndexChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 10: _t->_q_dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 11: _t->_q_updateIndexBeforeChange(); break;
        case 12: _t->_q_rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 13: _t->_q_rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->_q_modelDestroyed(); break;
        case 15: _t->_q_modelReset(); break;
        case 16: _t->_q_scroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Picker::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::activated)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::activated)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (Picker::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentIndexChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentIndexChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentTextChanged)) {
                *result = 4;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->count(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->currentIndex(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->currentText(); break;
        case 3: *reinterpret_cast< QVariant*>(_v) = _t->currentData(); break;
        case 4: *reinterpret_cast< int*>(_v) = _t->modelColumn(); break;
        case 5: *reinterpret_cast< int*>(_v) = _t->maxCount(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->highlightColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setCurrentIndex(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setCurrentText(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setModelColumn(*reinterpret_cast< int*>(_v)); break;
        case 5: _t->setMaxCount(*reinterpret_cast< int*>(_v)); break;
        case 6: _t->setHighlightColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}